

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::isUnconstrainedLp(HEkk *this)

{
  bool bVar1;
  long in_RDI;
  bool is_unconstrained_lp;
  
  bVar1 = *(int *)(in_RDI + 0x219c) < 1;
  if (bVar1) {
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kError,
                "HEkkDual::solve called for LP with non-positive (%d) number of constraints\n",
                (ulong)*(uint *)(in_RDI + 0x219c));
  }
  return bVar1;
}

Assistant:

bool HEkk::isUnconstrainedLp() {
  bool is_unconstrained_lp = lp_.num_row_ <= 0;
  if (is_unconstrained_lp)
    highsLogDev(
        options_->log_options, HighsLogType::kError,
        "HEkkDual::solve called for LP with non-positive (%" HIGHSINT_FORMAT
        ") number of constraints\n",
        lp_.num_row_);
  assert(!is_unconstrained_lp);
  return is_unconstrained_lp;
}